

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

QSQLiteDriver * __thiscall QSQLiteDriver::primaryIndex(QSQLiteDriver *this,QString *tablename)

{
  long lVar1;
  QSqlQuery *query;
  char cVar2;
  QSqlResult *pQVar3;
  bool in_DL;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_78;
  QSqlQuery q;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  query = (QSqlQuery *)(tablename->d).ptr;
  cVar2 = (**(code **)&(tablename->d).d[6].super_QArrayData)(tablename);
  if (cVar2 == '\0') {
    _q = (Data *)0x0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    local_78.size = 0;
    QSqlIndex::QSqlIndex((QSqlIndex *)this,(QString *)&q,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&q);
  }
  else {
    _q = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = (QSqlResult *)(*(code *)(tablename->d).d[0xc].super_QArrayData.alloc)(tablename);
    QSqlQuery::QSqlQuery(&q,pQVar3);
    QSqlQuery::setForwardOnly(SUB81(&q,0));
    QSQLiteDriverPrivate::getTableInfo((QSQLiteDriverPrivate *)this,query,(QString *)&q,in_DL);
    QSqlQuery::~QSqlQuery(&q);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QSqlIndex QSQLiteDriver::primaryIndex(const QString &tablename) const
{
    Q_D(const QSQLiteDriver);
    if (!isOpen())
        return QSqlIndex();

    QSqlQuery q(createResult());
    q.setForwardOnly(true);
    return d->getTableInfo(q, tablename, true);
}